

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * __thiscall
VulkanHppGenerator::generateRAIICommandDefinitions
          (string *__return_storage_ptr__,VulkanHppGenerator *this,
          vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
          *requireData,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *listedCommands,string *title)

{
  reference command_00;
  undefined8 title_00;
  bool bVar1;
  reference pRVar2;
  size_t initialSkipCount;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar3;
  string local_100;
  string local_e0;
  _Base_ptr local_c0;
  undefined1 local_b8;
  _Base_ptr local_a0;
  undefined1 local_98;
  reference local_90;
  NameLine *command;
  const_iterator __end2;
  const_iterator __begin2;
  vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_> *__range2;
  RequireData *require;
  const_iterator __end1;
  const_iterator __begin1;
  vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
  *__range1;
  string str;
  string *title_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *listedCommands_local;
  vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
  *requireData_local;
  VulkanHppGenerator *this_local;
  
  str.field_2._8_8_ = title;
  std::__cxx11::string::string((string *)&__range1);
  __end1 = std::
           vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
           ::begin(requireData);
  require = (RequireData *)
            std::
            vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
            ::end(requireData);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_VulkanHppGenerator::RequireData_*,_std::vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>_>
                      (&__end1,(__normal_iterator<const_VulkanHppGenerator::RequireData_*,_std::vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>_>
                                *)&require);
    title_00 = str.field_2._8_8_;
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pRVar2 = __gnu_cxx::
             __normal_iterator<const_VulkanHppGenerator::RequireData_*,_std::vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>_>
             ::operator*(&__end1);
    __end2 = std::
             vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>::
             begin(&pRVar2->commands);
    command = (NameLine *)
              std::
              vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>::
              end(&pRVar2->commands);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_VulkanHppGenerator::NameLine_*,_std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>_>
                        (&__end2,(__normal_iterator<const_VulkanHppGenerator::NameLine_*,_std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>_>
                                  *)&command);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_90 = __gnu_cxx::
                 __normal_iterator<const_VulkanHppGenerator::NameLine_*,_std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>_>
                 ::operator*(&__end2);
      pVar3 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(listedCommands,&local_90->name);
      command_00 = local_90;
      local_c0 = (_Base_ptr)pVar3.first._M_node;
      local_b8 = pVar3.second;
      local_a0 = local_c0;
      local_98 = local_b8;
      if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        initialSkipCount = determineInitialSkipCount(this,&local_90->name);
        generateRAIIHandleCommand(&local_e0,this,&command_00->name,initialSkipCount,true);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                   &local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
      }
      __gnu_cxx::
      __normal_iterator<const_VulkanHppGenerator::NameLine_*,_std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<const_VulkanHppGenerator::RequireData_*,_std::vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::string((string *)&local_100);
  addTitleAndProtection
            (__return_storage_ptr__,this,(string *)title_00,(string *)&__range1,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateRAIICommandDefinitions( std::vector<RequireData> const & requireData,
                                                                std::set<std::string> &          listedCommands,
                                                                std::string const &              title ) const
{
  std::string str;
  for ( auto const & require : requireData )
  {
    for ( auto const & command : require.commands )
    {
      if ( listedCommands.insert( command.name ).second )
      {
        str += generateRAIIHandleCommand( command.name, determineInitialSkipCount( command.name ), true );
      }
    }
  }
  return addTitleAndProtection( title, str );
}